

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

string * __thiscall
VectorInstance::op_removeFirst
          (string *__return_storage_ptr__,VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  bool bVar1;
  undefined8 *puVar2;
  string *this_00;
  const_iterator __position;
  allocator local_39;
  shared_ptr<Instance> instance;
  
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start != 0x20) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar2,&char_const*::typeinfo,0);
  }
  this_00 = (string *)&instance;
  get_shared_instance((string *)&instance,&this->_element_type);
  __position._M_current =
       (this->_value).
       super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  do {
    if (__position._M_current ==
        (this->_value).
        super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
LAB_00156bf4:
      std::__cxx11::string::string((string *)__return_storage_ptr__,"null",&local_39);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&instance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return __return_storage_ptr__;
    }
    bVar1 = InstanceIsEqualToComparator::operator()
                      ((InstanceIsEqualToComparator *)this_00,__position._M_current,&instance);
    if (bVar1) {
      std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::erase
                (&this->_value,__position);
      goto LAB_00156bf4;
    }
    __position._M_current = __position._M_current + 1;
  } while( true );
}

Assistant:

std::string VectorInstance::op_removeFirst(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    std::shared_ptr<Instance> instance = get_shared_instance(_element_type, arguments[0]);
    for (auto it = _value.begin(); it != _value.end(); it++)
        if (InstanceIsEqualToComparator()(*it, instance)) {
            _value.erase(it);
            break;
        }
    return "null";
}